

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UTApprovals.h
# Opt level: O3

void __thiscall ApprovalTests::cfg::reporter::on(reporter *this,test_end test_end)

{
  pointer pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  
  pbVar3 = (this->currentTest).sections.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->currentTest).sections.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar3 != pbVar4) {
    do {
      (this->currentTest).sections.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
      pcVar1 = pbVar4[-1]._M_dataplus._M_p;
      pbVar2 = pbVar4 + -1;
      pbVar4 = pbVar4 + -1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &pbVar2->field_2) {
        operator_delete(pcVar1,(pbVar2->field_2)._M_allocated_capacity + 1);
        pbVar3 = (this->currentTest).sections.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (this->currentTest).sections.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
    } while (pbVar3 != pbVar4);
  }
  boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
            (&this->super_reporter<boost::ext::ut::v1_1_8::printer>,test_end);
  return;
}

Assistant:

auto on(boost::ut::events::test_end test_end) -> void
            {
                while (!currentTest.sections.empty())
                {
                    currentTest.sections.pop_back();
                }
                boost::ut::reporter<boost::ut::printer>::on(test_end);
            }